

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg5s.cc
# Opt level: O2

void __thiscall
trng::mrg5s::seed(mrg5s *this,result_type s1,result_type s2,result_type s3,result_type s4,
                 result_type s5)

{
  int iVar1;
  int iVar2;
  
  (this->S).r[0] = (-(uint)(s1 % 0x7fffa78f < 0) & 0x7fffa78f) + s1 % 0x7fffa78f;
  (this->S).r[1] = (-(uint)(s2 % 0x7fffa78f < 0) & 0x7fffa78f) + s2 % 0x7fffa78f;
  (this->S).r[2] = (-(uint)(s3 % 0x7fffa78f < 0) & 0x7fffa78f) + s3 % 0x7fffa78f;
  (this->S).r[3] = (-(uint)(s4 % 0x7fffa78f < 0) & 0x7fffa78f) + s4 % 0x7fffa78f;
  iVar1 = s5 % 0x7fffa78f;
  iVar2 = iVar1 + 0x7fffa78f;
  if (-1 < iVar1) {
    iVar2 = iVar1;
  }
  (this->S).r[4] = iVar2;
  return;
}

Assistant:

void mrg5s::seed(mrg5s::result_type s1, mrg5s::result_type s2, mrg5s::result_type s3,
                   mrg5s::result_type s4, mrg5s::result_type s5) {
    S.r[0] = s1 % modulus;
    if (S.r[0] < 0)
      S.r[0] += modulus;
    S.r[1] = s2 % modulus;
    if (S.r[1] < 0)
      S.r[1] += modulus;
    S.r[2] = s3 % modulus;
    if (S.r[2] < 0)
      S.r[2] += modulus;
    S.r[3] = s4 % modulus;
    if (S.r[3] < 0)
      S.r[3] += modulus;
    S.r[4] = s5 % modulus;
    if (S.r[4] < 0)
      S.r[4] += modulus;
  }